

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall
Clasp::SharedMinimizeData::setMode
          (SharedMinimizeData *this,MinimizeMode m,wsum_t *bound,uint32 boundSize)

{
  uint uVar1;
  long lVar2;
  pointer plVar3;
  long lVar4;
  uint32 i;
  uint uVar5;
  bool bVar6;
  long lVar7;
  
  this->mode_ = m;
  if (bound != (wsum_t *)0x0 && boundSize != 0) {
    uVar5 = 0;
    LOCK();
    (this->gCount_).super___atomic_base<unsigned_int>._M_i = 0;
    UNLOCK();
    this->optGen_ = 0;
    uVar1 = (this->adjust_).ebo_.size;
    if (uVar1 < boundSize) {
      boundSize = uVar1;
    }
    bVar6 = false;
    for (; boundSize != uVar5; uVar5 = uVar5 + 1) {
      lVar2 = (this->adjust_).ebo_.buf[uVar5];
      lVar7 = bound[uVar5] - lVar2;
      lVar4 = 0x7fffffffffffffff;
      if (bound[uVar5] <= lVar2 + 0x7fffffffffffffff) {
        lVar4 = lVar7;
      }
      if (lVar2 < 0) {
        lVar7 = lVar4;
      }
      lVar2 = this->lower_[uVar5].super___atomic_base<long>._M_i;
      lVar4 = lVar7 - lVar2;
      if (lVar4 < 0 && !bVar6) {
        return false;
      }
      this->up_[0].ebo_.buf[uVar5] = lVar7;
      bVar6 = (bool)(bVar6 | (lVar7 != lVar2 && -1 < lVar4));
    }
    uVar1 = this->up_[0].ebo_.size;
    plVar3 = this->up_[0].ebo_.buf;
    for (; uVar1 != boundSize; boundSize = boundSize + 1) {
      plVar3[boundSize] = 0x7fffffffffffffff;
    }
  }
  return true;
}

Assistant:

bool SharedMinimizeData::setMode(MinimizeMode m, const wsum_t* bound, uint32 boundSize)  {
	mode_ = m;
	if (boundSize && bound) {
		SumVec& opt = up_[0];
		bool    ok  = false;
		gCount_     = 0;
		optGen_     = 0;
		boundSize   = std::min(boundSize, numRules());
		for (uint32 i = 0, end = boundSize; i != end; ++i) {
			wsum_t B = bound[i], a = adjust(i);
			B        = a >= 0 || (maxBound() + a) >= B ? B - a : maxBound();
			wsum_t d = B - lower_[i];
			if (d < 0 && !ok) { return false; }
			opt[i]   = B;
			ok       = ok || d > 0;
		}
		for (uint32 i = boundSize, end = (uint32)opt.size(); i != end; ++i) { opt[i] = maxBound(); }
	}
	return true;
}